

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O1

string * google::protobuf::StringPrintfVector
                   (string *__return_storage_ptr__,char *format,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *v)

{
  pointer pbVar1;
  LogMessage *pLVar2;
  long lVar3;
  ulong uVar4;
  pointer pbVar5;
  ulong uVar6;
  long lVar7;
  char *cstr [32];
  undefined8 local_168 [4];
  undefined4 local_148;
  undefined4 uStack_140;
  undefined4 local_138;
  undefined4 uStack_130;
  undefined4 local_128;
  undefined4 uStack_120;
  undefined4 local_118;
  undefined4 uStack_110;
  undefined4 local_108;
  undefined4 uStack_100;
  undefined4 local_f8;
  undefined4 uStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  LogMessage local_60;
  
  if (0x400 < (ulong)((long)(v->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(v->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/stringprintf.cc"
               ,0x8e);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (v.size()) <= (kStringPrintfVectorMaxArgs): ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"StringPrintfVector currently only supports up to ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,0x20);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," arguments. ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"Feel free to add support for more if you need it.");
    internal::LogFinisher::operator=((LogFinisher *)local_168,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  pbVar5 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pbVar1 - (long)pbVar5 >> 5;
  uVar4 = (long)pbVar1 - (long)pbVar5;
  if (uVar4 != 0) {
    lVar7 = 0;
    do {
      local_168[lVar7] = (pbVar5->_M_dataplus)._M_p;
      lVar7 = lVar7 + 1;
      pbVar5 = pbVar5 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar7);
  }
  if ((uVar4 & 0x1ffffffc00) == 0) {
    uVar4 = (ulong)((uint)lVar3 & 0x1f);
    do {
      uVar6 = uVar4 + 1;
      local_168[uVar4] = string_printf_empty_block;
      uVar4 = uVar6;
    } while ((int)uVar6 != 0x20);
  }
  StringPrintf_abi_cxx11_
            (__return_storage_ptr__,format,local_168[0],local_168[1],local_168[2],local_168[3],
             local_148,uStack_140,local_138,uStack_130,local_128,uStack_120,local_118,uStack_110,
             local_108,uStack_100,local_f8,uStack_f0,local_e8,uStack_e0,local_d8,uStack_d0,local_c8,
             uStack_c0,local_b8,uStack_b0,local_a8,uStack_a0,local_98,uStack_90,local_88,uStack_80,
             local_78);
  return __return_storage_ptr__;
}

Assistant:

string StringPrintfVector(const char* format, const vector<string>& v) {
  GOOGLE_CHECK_LE(v.size(), kStringPrintfVectorMaxArgs)
      << "StringPrintfVector currently only supports up to "
      << kStringPrintfVectorMaxArgs << " arguments. "
      << "Feel free to add support for more if you need it.";

  // Add filler arguments so that bogus format+args have a harder time
  // crashing the program, corrupting the program (%n),
  // or displaying random chunks of memory to users.

  const char* cstr[kStringPrintfVectorMaxArgs];
  for (int i = 0; i < v.size(); ++i) {
    cstr[i] = v[i].c_str();
  }
  for (int i = v.size(); i < GOOGLE_ARRAYSIZE(cstr); ++i) {
    cstr[i] = &string_printf_empty_block[0];
  }

  // I do not know any way to pass kStringPrintfVectorMaxArgs arguments,
  // or any way to build a va_list by hand, or any API for printf
  // that accepts an array of arguments.  The best I can do is stick
  // this COMPILE_ASSERT right next to the actual statement.

  GOOGLE_COMPILE_ASSERT(kStringPrintfVectorMaxArgs == 32, arg_count_mismatch);
  return StringPrintf(format,
                      cstr[0], cstr[1], cstr[2], cstr[3], cstr[4],
                      cstr[5], cstr[6], cstr[7], cstr[8], cstr[9],
                      cstr[10], cstr[11], cstr[12], cstr[13], cstr[14],
                      cstr[15], cstr[16], cstr[17], cstr[18], cstr[19],
                      cstr[20], cstr[21], cstr[22], cstr[23], cstr[24],
                      cstr[25], cstr[26], cstr[27], cstr[28], cstr[29],
                      cstr[30], cstr[31]);
}